

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
::set_ctrl(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
           *this,size_t i,ctrl_t h)

{
  if (i < this->capacity_) {
    this->ctrl_[i] = h;
    this->ctrl_[(ulong)((uint)this->capacity_ & 0xf) + 1 + (i - 0x10 & this->capacity_)] = h;
    return;
  }
  __assert_fail("i < capacity_",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x9cd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, bool>>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, bool>>>>::set_ctrl(size_t, ctrl_t) [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, std::pair<unsigned long, bool>>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::pair<unsigned long, bool>>>]"
               );
}

Assistant:

void set_ctrl(size_t i, ctrl_t h)
			{
				assert(i < capacity_);

				if (IsFull(h)) {
					SanitizerUnpoisonObject(slots_ + i);
				}
				else {
					SanitizerPoisonObject(slots_ + i);
				}

				ctrl_[i] = h;
				ctrl_[((i - Group::kWidth) & capacity_) + 1 +
				                           ((Group::kWidth - 1) & capacity_)] = h;
			}